

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O1

LispPTR COM_getfileinfo(LispPTR *args)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  LispPTR LVar6;
  char *pcVar8;
  size_t sVar9;
  int *piVar10;
  passwd *ppVar11;
  ulong uVar12;
  char cVar13;
  DLword *pDVar14;
  long lVar15;
  char ver [16];
  stat sbuf;
  char name [255];
  char host [255];
  char file [4096];
  char lfname [4101];
  char dir [4096];
  char local_32e8 [16];
  stat local_32d8;
  char local_3248 [256];
  undefined4 local_3148;
  char local_3144;
  char local_3048 [4096];
  char local_2048 [4112];
  char local_1038 [4104];
  long lVar7;
  
  iVar4 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar4 != 0) {
    *Lisp_errno = 100;
    return 0;
  }
  uVar2 = args[3];
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  Lisp_errno = (int *)(Lisp_world + uVar2);
  uVar2 = *args;
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
    iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4) * 2;
    iVar5 = 5;
  }
  else if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
    iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
    iVar5 = 3;
  }
  else {
    iVar4 = error("LispStringLength: Not a character array.\n");
    iVar5 = 5;
  }
  if (0x1005 < iVar4 + iVar5) {
    *Lisp_errno = 200;
    return 0;
  }
  uVar2 = *args;
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
  iVar5 = 0x1000;
  if (iVar4 < 0x1000) {
    iVar5 = iVar4;
  }
  lVar7 = (long)iVar5;
  if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
    if (iVar4 == 0) {
      pcVar8 = local_2048;
    }
    else {
      lVar7 = lVar7 + (ulong)(lVar7 == 0);
      pDVar14 = Lisp_world +
                (ulong)Lisp_world[(ulong)uVar2 + 2] +
                (ulong)(*(uint *)(Lisp_world + uVar2) & 0xfffffff);
      pcVar8 = local_2048;
      do {
        *pcVar8 = *(char *)((ulong)pDVar14 ^ 2);
        pcVar8 = pcVar8 + 1;
        pDVar14 = pDVar14 + 1;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    *pcVar8 = '\0';
  }
  else if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
    if (iVar4 != 0) {
      uVar3 = *(uint *)(Lisp_world + uVar2);
      uVar1 = Lisp_world[(ulong)uVar2 + 2];
      lVar15 = 0;
      do {
        local_2048[lVar15] =
             *(char *)((long)Lisp_world + lVar15 + (ulong)uVar1 + (ulong)(uVar3 & 0xfffffff) * 2 ^ 3
                      );
        lVar15 = lVar15 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar15);
    }
    local_2048[lVar7] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  separate_host(local_2048,(char *)&local_3148);
  if ((char)local_3148 != '\0') {
    pcVar8 = (char *)((long)&local_3148 + 1);
    cVar13 = (char)local_3148;
    do {
      if ((byte)(cVar13 + 0x9fU) < 0x1a) {
        pcVar8[-1] = cVar13 + -0x20;
      }
      cVar13 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar13 != '\0');
  }
  if (local_3148 == 0x4b5344) {
    unixpathname(local_2048,local_3048,1,0);
    iVar4 = unpack_filename(local_3048,local_1038,local_3248,local_32e8,1);
    if (iVar4 == 0) {
      return 0;
    }
    iVar4 = true_name(local_1038);
    if (iVar4 != -1) {
      return 0;
    }
    if (local_3248[0] == '\0') {
      strcpy(local_3048,local_1038);
    }
    else {
      iVar4 = get_version_array(local_1038,local_3248);
      if (iVar4 == 0) {
        return 0;
      }
      strcpy(local_3048,local_3248);
      if (local_32e8[0] != '\0') {
        sVar9 = strlen(local_3048);
        (local_3048 + sVar9)[0] = '.';
        (local_3048 + sVar9)[1] = '~';
        local_3048[sVar9 + 2] = '\0';
        strcat(local_3048,local_32e8);
        sVar9 = strlen(local_3048);
        (local_3048 + sVar9)[0] = '~';
        (local_3048 + sVar9)[1] = '\0';
      }
      iVar4 = get_old(local_1038,VA.files,local_3048,local_3248);
      if (iVar4 == 0) {
        return 0;
      }
    }
  }
  else {
    if (local_3144 != '\0' || local_3148 != 0x58494e55) {
      return 0;
    }
    unixpathname(local_2048,local_3048,0,0);
  }
  alarm(TIMEOUT_TIME);
  piVar10 = __errno_location();
  do {
    *piVar10 = 0;
    iVar4 = stat(local_3048,&local_32d8);
    if (iVar4 != -1) break;
  } while (*piVar10 == 4);
  LVar6 = 0;
  alarm(0);
  if (iVar4 != 0) {
    *Lisp_errno = *piVar10;
    return 0;
  }
  switch(args[1]) {
  case 0xe0001:
    uVar2 = args[2];
    local_32d8.st_mode = (__mode_t)local_32d8.st_size;
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
      local_32d8.st_mode = (__mode_t)local_32d8.st_size;
    }
    break;
  case 0xe0002:
    uVar2 = args[2];
    local_32d8.st_atim.tv_sec._0_4_ = (int)local_32d8.st_mtim.tv_sec;
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
      local_32d8.st_atim.tv_sec._0_4_ = (int)local_32d8.st_mtim.tv_sec;
    }
    goto LAB_0011f396;
  case 0xe0003:
    uVar2 = args[2];
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
LAB_0011f396:
    *(int *)(Lisp_world + uVar2) = (int)local_32d8.st_atim.tv_sec + 0x1c94b00;
    goto LAB_0011f402;
  default:
    goto switchD_0011f1cd_caseD_e0004;
  case 0xe0005:
    alarm(TIMEOUT_TIME);
LAB_0011f3b1:
    *piVar10 = 0;
    ppVar11 = getpwuid(local_32d8.st_uid);
    if (ppVar11 == (passwd *)0x0) goto code_r0x0011f3c9;
    alarm(0);
    uVar2 = args[2];
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    pcVar8 = ppVar11->pw_name;
    uVar12 = strlen(pcVar8);
    pDVar14 = Lisp_world;
    if (uVar12 != 0) {
      uVar2 = *(uint *)(Lisp_world + uVar2);
      sVar9 = 0;
      do {
        *(char *)((long)pDVar14 + sVar9 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3) = pcVar8[sVar9];
        sVar9 = sVar9 + 1;
      } while (uVar12 != sVar9);
    }
LAB_0011f50a:
    if (uVar12 < 0x10000) {
      return (uint)uVar12 | 0xe0000;
    }
    error("Not Smallp data");
    goto LAB_0011f52b;
  case 0xe0006:
    uVar2 = args[2];
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    break;
  case 0xe0008:
    LVar6 = car(args[2]);
    LVar6 = cdr(LVar6);
    if ((LVar6 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar6);
    }
    *(__mode_t *)(Lisp_world + LVar6) = (__mode_t)local_32d8.st_size;
    LVar6 = cdr(args[2]);
    LVar6 = car(LVar6);
    LVar6 = cdr(LVar6);
    if ((LVar6 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar6);
    }
    *(int *)(Lisp_world + LVar6) = (int)local_32d8.st_mtim.tv_sec + 0x1c94b00;
    LVar6 = cdr(args[2]);
    LVar6 = cdr(LVar6);
    LVar6 = car(LVar6);
    LVar6 = cdr(LVar6);
    if ((LVar6 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar6);
    }
    *(int *)(Lisp_world + LVar6) = (int)local_32d8.st_atim.tv_sec + 0x1c94b00;
    LVar6 = cdr(args[2]);
    LVar6 = cdr(LVar6);
    LVar6 = cdr(LVar6);
    LVar6 = car(LVar6);
    LVar6 = cdr(LVar6);
    if ((LVar6 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar6);
    }
    *(__mode_t *)(Lisp_world + LVar6) = local_32d8.st_mode;
    alarm(TIMEOUT_TIME);
    do {
      *piVar10 = 0;
      ppVar11 = getpwuid(local_32d8.st_uid);
      if (ppVar11 != (passwd *)0x0) {
        alarm(0);
        LVar6 = cdr(args[2]);
        LVar6 = cdr(LVar6);
        LVar6 = cdr(LVar6);
        LVar6 = cdr(LVar6);
        LVar6 = car(LVar6);
        LVar6 = cdr(LVar6);
        if ((LVar6 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar6);
        }
        pcVar8 = ppVar11->pw_name;
        uVar12 = strlen(pcVar8);
        pDVar14 = Lisp_world;
        if (uVar12 != 0) {
          uVar2 = *(uint *)(Lisp_world + LVar6);
          sVar9 = 0;
          do {
            *(char *)((long)pDVar14 + sVar9 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3) = pcVar8[sVar9];
            sVar9 = sVar9 + 1;
          } while (uVar12 != sVar9);
        }
        goto LAB_0011f50a;
      }
    } while (*piVar10 == 4);
LAB_0011f3d0:
    alarm(0);
LAB_0011f52b:
    LVar6 = 0xe0000;
    goto switchD_0011f1cd_caseD_e0004;
  }
  *(__mode_t *)(Lisp_world + uVar2) = local_32d8.st_mode;
LAB_0011f402:
  LVar6 = 0x4c;
switchD_0011f1cd_caseD_e0004:
  return LVar6;
code_r0x0011f3c9:
  if (*piVar10 != 4) goto LAB_0011f3d0;
  goto LAB_0011f3b1;
}

Assistant:

LispPTR COM_getfileinfo(LispPTR *args)
{
  int dskp, rval;
  size_t len;
  unsigned *bufp;
#ifndef DOS
  struct passwd *pwd;
#endif
  char *base;
  char lfname[MAXPATHLEN + 5], file[MAXPATHLEN], host[MAXNAMLEN];
  char dir[MAXPATHLEN], name[MAXNAMLEN], ver[VERSIONLEN];
  struct stat sbuf;
  LispPTR laddr;
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen; /* len of extension, for making backup filename */
#endif        /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  LispStringLength(args[0], rval, dskp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = dskp ? rval + 4 + 1 : rval + 2 + 1;
  /* Add 5 for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);
#ifdef DOS
  separate_host(lfname, host, drive);
#else
  separate_host(lfname, host);
#endif

  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

/*
 * Convert a Lisp file name to UNIX one.  If host is DSK, we also have to
 * convert a version field.
 */
#ifdef DOS
  unixpathname(lfname, file, dskp, 0, drive, &extlen, rawname);
#else  /* DOS */
  unixpathname(lfname, file, dskp, 0);
#endif /* DOS */

  /*
   * The file name which has been passed from Lisp is sometimes different
   * from the actual file name on DSK, even after the Lisp name is converted
   * to UNIX form with unixpathname.  The Lisp code for GETFILEINFO always
   * recognizes a file with old mode.  Thus, we recognize it again using
   * get_old routine.  It will let us know the "real accessible" name of
   * the file.
   */
  if (dskp) {
    if (unpack_filename(file, dir, name, ver, 1) == 0) return (NIL);
    if (true_name(dir) != -1) return (0);
    if (strcmp(name, "") == 0) {
      /*
       * The directory is specified.
       */
      strcpy(file, dir);
    } else {
      if (get_version_array(dir, name) == 0) return (NIL);
      ConcNameAndVersion(name, ver, file);
      if (get_old(dir, VA.files, file, name) == 0) return (NIL);
    }
  }

  TIMEOUT(rval = stat(file, &sbuf));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (NIL);
  }

  switch (args[1]) {
    case LENGTH:
      bufp = (unsigned *)NativeAligned4FromLAddr(args[2]);
      *bufp = (unsigned)sbuf.st_size;
      return (ATOM_T);

    case WDATE:
      bufp = (unsigned *)NativeAligned4FromLAddr(args[2]);
      *bufp = (unsigned)ToLispTime(sbuf.st_mtime);
      return (ATOM_T);

    case RDATE:
      bufp = (unsigned *)NativeAligned4FromLAddr(args[2]);
      *bufp = (unsigned)ToLispTime(sbuf.st_atime);
      return (ATOM_T);

    case PROTECTION:
      bufp = (unsigned *)NativeAligned4FromLAddr(args[2]);
      *bufp = sbuf.st_mode;
      return (ATOM_T);

    case AUTHOR: {
#ifndef DOS
      TIMEOUT0(pwd = getpwuid(sbuf.st_uid));
      if (pwd == (struct passwd *)NULL) {
        /*
         * Returns Lisp 0.  Lisp code handles this case as author
         * unknown.  The returned value from Lisp GETFILEINFO
         * function would be "".
         */
        return (SMALLP_ZERO);
      }
      STRING_BASE(args[2], base);
      len = strlen(pwd->pw_name);
#ifndef BYTESWAP
      strncpy(base, pwd->pw_name, len);
#else
      StrNCpyFromCToLisp(base, pwd->pw_name, len);
#endif /* BYTESWAP */
#endif /* DOS */
      return (GetPosSmallp(len));
    }
    case ALL: {
      /*
       * The format of the buffer which has been allocated by Lisp
       * is as follows.
       * 	((LENGTH	.	fixp)
       *	 (WDATE		.	fixp)
       *	 (RDATE		.	fixp)
       *	 (PROTECTION	.	fixp)
       *	 (AUTHOR	.	string))
       */
      laddr = cdr(car(args[2]));
      bufp = (unsigned *)NativeAligned4FromLAddr(laddr);
      *bufp = sbuf.st_size;

      laddr = cdr(car(cdr(args[2])));
      bufp = (unsigned *)NativeAligned4FromLAddr(laddr);
      *bufp = ToLispTime(sbuf.st_mtime);

      laddr = cdr(car(cdr(cdr(args[2]))));
      bufp = (unsigned *)NativeAligned4FromLAddr(laddr);
      *bufp = ToLispTime(sbuf.st_atime);

      laddr = cdr(car(cdr(cdr(cdr(args[2])))));
      bufp = (unsigned *)NativeAligned4FromLAddr(laddr);
      *bufp = sbuf.st_mode;
#ifndef DOS
      TIMEOUT0(pwd = getpwuid(sbuf.st_uid));
      if (pwd == (struct passwd *)NULL) { return (SMALLP_ZERO); }
      laddr = cdr(car(cdr(cdr(cdr(cdr(args[2]))))));
      STRING_BASE(laddr, base);
      len = strlen(pwd->pw_name);
#ifndef BYTESWAP
      strncpy(base, pwd->pw_name, len);
#else
      StrNCpyFromCToLisp(base, pwd->pw_name, len);
#endif /* BYTESWAP	 */
#endif /* DOS */
      return (GetPosSmallp(len));
    }
    default: return (NIL);
  }
}